

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O0

void __thiscall cmCursesBoolWidget::SetValueAsBool(cmCursesBoolWidget *this,bool value)

{
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [39];
  undefined1 local_11;
  cmCursesBoolWidget *pcStack_10;
  bool value_local;
  cmCursesBoolWidget *this_local;
  
  local_11 = value;
  pcStack_10 = this;
  if (value) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"ON",&local_39);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"OFF",&local_71);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void cmCursesBoolWidget::SetValueAsBool(bool value)
{
  if (value) {
    this->SetValue("ON");
  } else {
    this->SetValue("OFF");
  }
}